

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O2

void __thiscall DActiveButton::Serialize(DActiveButton *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"side",&this->m_Side);
  pFVar1 = FSerializer::operator()(pFVar1,"part",&this->m_Part);
  pFVar1 = FSerializer::operator()(pFVar1,"switchdef",&this->m_SwitchDef);
  pFVar1 = FSerializer::operator()(pFVar1,"frame",&this->m_Frame);
  pFVar1 = FSerializer::operator()(pFVar1,"timer",&this->m_Timer);
  pFVar1 = FSerializer::operator()(pFVar1,"fippable",&this->bFlippable);
  pFVar1 = FSerializer::operator()(pFVar1,"pos",&this->m_Pos);
  FSerializer::operator()(pFVar1,"returning",&this->bReturning);
  return;
}

Assistant:

void DActiveButton::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("side", m_Side)
		("part", m_Part)
		("switchdef", m_SwitchDef)
		("frame", m_Frame)
		("timer", m_Timer)
		("fippable", bFlippable)
		("pos", m_Pos)
		("returning", bReturning);
}